

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Gia_Man_t * Acb_NtkDeriveMiterCnfInter2(Gia_Man_t *p,int iTar,int nTars)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  Gia_Man_t *pGVar4;
  Gia_Man_t *p_00;
  int local_3c;
  Gia_Man_t *pGStack_38;
  int v;
  Gia_Man_t *pCof;
  Gia_Man_t *pCof1;
  Gia_Man_t *pCof0;
  Gia_Man_t *pInter;
  int nTars_local;
  int iTar_local;
  Gia_Man_t *p_local;
  
  pGStack_38 = Gia_ManDup(p);
  for (local_3c = 0; local_3c < iTar; local_3c = local_3c + 1) {
    iVar1 = Gia_ManCiNum(pGStack_38);
    pGVar3 = Gia_ManDupUniv(pGStack_38,(iVar1 - nTars) + local_3c);
    iVar1 = Gia_ManCiNum(pGVar3);
    iVar2 = Gia_ManCiNum(pGStack_38);
    if (iVar1 != iVar2) {
      __assert_fail("Gia_ManCiNum(pCof) == Gia_ManCiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                    ,0x861,"Gia_Man_t *Acb_NtkDeriveMiterCnfInter2(Gia_Man_t *, int, int)");
    }
    Gia_ManStop(pGStack_38);
    pGStack_38 = Acb_NtkEcoSynthesize(pGVar3);
    Gia_ManStop(pGVar3);
  }
  iVar1 = Gia_ManCiNum(pGStack_38);
  pGVar3 = Gia_ManDupCofactorVar(pGStack_38,(iVar1 - nTars) + iTar,1);
  iVar1 = Gia_ManCiNum(pGStack_38);
  pGVar4 = Gia_ManDupCofactorVar(pGStack_38,(iVar1 - nTars) + iTar,0);
  Gia_ManStop(pGStack_38);
  p_00 = Acb_NtkEcoSynthesize(pGVar3);
  Gia_ManStop(pGVar3);
  pGVar3 = Acb_NtkEcoSynthesize(pGVar4);
  Gia_ManStop(pGVar4);
  printf("Cof0 : ");
  Gia_ManPrintStats(p_00,(Gps_Par_t *)0x0);
  printf("Cof1 : ");
  Gia_ManPrintStats(pGVar3,(Gps_Par_t *)0x0);
  iVar1 = Gia_ManAndNum(pGVar3);
  if (iVar1 != 0) {
    iVar1 = Gia_ManAndNum(p_00);
    if (iVar1 != 0) {
      pCof0 = Gia_ManInterOneInt(pGVar3,p_00,7);
      goto LAB_0040c1b3;
    }
  }
  pCof0 = Gia_ManDup(pGVar3);
LAB_0040c1b3:
  Gia_ManStop(p_00);
  Gia_ManStop(pGVar3);
  pGVar3 = Abc_GiaSynthesizeInter(pCof0);
  Gia_ManStop(pCof0);
  pGVar4 = Gia_ManDupRemovePis(pGVar3,nTars);
  Gia_ManStop(pGVar3);
  return pGVar4;
}

Assistant:

Gia_Man_t * Acb_NtkDeriveMiterCnfInter2( Gia_Man_t * p, int iTar, int nTars )
{
//    extern Gia_Man_t * Gia_ManInterOne( Gia_Man_t * pNtkOn, Gia_Man_t * pNtkOff, int fVerbose );
    extern Gia_Man_t * Abc_GiaSynthesizeInter( Gia_Man_t * p );
    Gia_Man_t * pInter, * pCof0, * pCof1, * pCof = Gia_ManDup( p ); int v;
    for ( v = 0; v < iTar; v++ )
    {
        pCof = Gia_ManDupUniv( p = pCof, Gia_ManCiNum(pCof) - nTars + v );
        assert( Gia_ManCiNum(pCof) == Gia_ManCiNum(p) );
        Gia_ManStop( p );

        pCof = Acb_NtkEcoSynthesize( p = pCof );
        Gia_ManStop( p );
    }
    pCof0 = Gia_ManDupCofactorVar( pCof, Gia_ManCiNum(pCof) - nTars + iTar, 1 );
    pCof1 = Gia_ManDupCofactorVar( pCof, Gia_ManCiNum(pCof) - nTars + iTar, 0 );
    Gia_ManStop( pCof );
    pCof0 = Acb_NtkEcoSynthesize( p = pCof0 );
    Gia_ManStop( p );
    pCof1 = Acb_NtkEcoSynthesize( p = pCof1 );
    Gia_ManStop( p );

    printf( "Cof0 : " );
    Gia_ManPrintStats( pCof0, NULL );
    printf( "Cof1 : " );
    Gia_ManPrintStats( pCof1, NULL );

    if ( Gia_ManAndNum(pCof1) == 0 || Gia_ManAndNum(pCof0) == 0 )
        pInter = Gia_ManDup(pCof1);
    else
        pInter = Gia_ManInterOneInt( pCof1, pCof0, 7 );
    Gia_ManStop( pCof0 );
    Gia_ManStop( pCof1 );
    pInter = Abc_GiaSynthesizeInter( p = pInter );
    Gia_ManStop( p );
    //Gia_ManPrintStats( pInter, NULL );
    pInter = Gia_ManDupRemovePis( p = pInter, nTars );
    Gia_ManStop( p );
    //Gia_ManPrintStats( pInter, NULL );
    return pInter;
}